

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O1

timestamp_t
duckdb::AddOperator::Operation<duckdb::date_t,duckdb::dtime_t,duckdb::timestamp_t>
          (date_t left,dtime_t right)

{
  bool bVar1;
  OutOfRangeException *this;
  timestamp_t result;
  timestamp_t local_48;
  string local_40;
  
  if (left.days == -0x7fffffff) {
    local_48.value = -0x7fffffffffffffff;
  }
  else if (left.days == 0x7fffffff) {
    local_48.value = 0x7fffffffffffffff;
  }
  else {
    bVar1 = Timestamp::TryFromDatetime(left,right,&local_48);
    if (!bVar1) {
      this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Timestamp out of range","");
      OutOfRangeException::OutOfRangeException(this,&local_40);
      __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return (timestamp_t)local_48.value;
}

Assistant:

timestamp_t AddOperator::Operation(date_t left, dtime_t right) {
	if (left == date_t::infinity()) {
		return timestamp_t::infinity();
	} else if (left == date_t::ninfinity()) {
		return timestamp_t::ninfinity();
	}
	timestamp_t result;
	if (!Timestamp::TryFromDatetime(left, right, result)) {
		throw OutOfRangeException("Timestamp out of range");
	}
	return result;
}